

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O3

void __thiscall Tank::print_out_of_map(Tank *this)

{
  ostream *poVar1;
  string local_28;
  
  to_str_abi_cxx11_(&local_28,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_28._M_dataplus._M_p,local_28._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," rolled out of battlefield",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Tank::print_out_of_map() const {
    std::cout << to_str() << " rolled out of battlefield" << std::endl;
}